

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2ThreadTest::Operation::readGLObject
          (Operation *this,SharedPtr<deqp::egl::GLES2ThreadTest::Object> *object)

{
  Object *pOVar1;
  size_t in_RCX;
  SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> local_30;
  SharedPtr<tcu::ThreadUtil::Event> local_20;
  
  pOVar1 = object->m_ptr;
  local_20.m_ptr = (this->super_Operation).m_event.m_ptr;
  local_20.m_state = (this->super_Operation).m_event.m_state;
  if (local_20.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_20.m_state)->strongRefCount = (local_20.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_20.m_state)->weakRefCount = (local_20.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  tcu::ThreadUtil::Object::read
            (&pOVar1->super_Object,(int)&local_20,&(this->super_Operation).m_deps,in_RCX);
  de::SharedPtr<tcu::ThreadUtil::Event>::~SharedPtr(&local_20);
  pOVar1 = object->m_ptr;
  local_30.m_ptr = (this->m_sync).m_ptr;
  local_30.m_state = (this->m_sync).m_state;
  if (local_30.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_30.m_state)->strongRefCount = (local_30.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_30.m_state)->weakRefCount = (local_30.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  Object::readGL(pOVar1,&local_30,&this->m_syncDeps);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>::release(&local_30);
  return;
}

Assistant:

void Operation::readGLObject (SharedPtr<Object> object)
{
	object->read(m_event, m_deps);
	object->readGL(m_sync, m_syncDeps);
}